

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHuf.cpp
# Opt level: O2

void anon_unknown.dwarf_1382a9::fill2(unsigned_short *data,int n,int m,Rand48 *rand48)

{
  int i;
  long lVar1;
  undefined4 in_register_00000014;
  int iVar2;
  double dVar3;
  
  for (lVar1 = 0; lVar1 != 1000000; lVar1 = lVar1 + 1) {
    data[lVar1] = 0;
  }
  iVar2 = 0;
  if (0 < n) {
    iVar2 = n;
  }
  while (iVar2 != 0) {
    dVar3 = (double)Imath_2_5::erand48((ushort *)CONCAT44(in_register_00000014,m));
    lVar1 = Imath_2_5::nrand48((ushort *)CONCAT44(in_register_00000014,m));
    data[lVar1 % 1000000] = (unsigned_short)(int)(dVar3 * 65536.0);
    iVar2 = iVar2 + -1;
  }
  return;
}

Assistant:

void
fill2 (unsigned short data[/*n*/], int n, int m, IMATH_NAMESPACE::Rand48 & rand48)
{
    for (int i = 0; i < n; ++i)
	data[i] = 0;

    for (int i = 0; i < m; ++i)
	data[rand48.nexti() % n] = (unsigned short) (rand48.nextf() * (USHRT_MAX + 1));
}